

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs5ReplaceImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,JavascriptString *replace,bool noResult)

{
  char16 *s;
  char16 cVar1;
  RegexPattern *pattern;
  RecyclableObject *nonMatchValue;
  undefined8 uVar2;
  RuntimeFunction *pRVar3;
  bool isGlobal;
  bool isSticky;
  bool bVar4;
  uint16 uVar5;
  ushort uVar6;
  ushort uVar7;
  charcount_t cVar8;
  charcount_t inputLength;
  uint uVar9;
  charcount_t cVar10;
  uint uVar11;
  char16 *pcVar12;
  char16 *input_00;
  GroupInfo GVar13;
  GroupInfo GVar14;
  RecyclableObject *aValue;
  JavascriptString *pJVar15;
  ushort uVar16;
  uint uVar17;
  CharCount CVar18;
  uint uVar19;
  ulong uVar20;
  JavascriptLibrary *pJVar21;
  int iVar22;
  undefined7 in_register_00000081;
  GroupInfo GVar23;
  CharCount CVar24;
  CharCount CVar25;
  Type offset;
  ulong uVar26;
  RuntimeFunction *pRVar27;
  RuntimeFunction *pRVar28;
  undefined1 local_328 [8];
  Builder<256U> concatenated;
  undefined1 local_e8 [8];
  RegexMatchState state;
  GroupInfo local_58;
  Type local_48;
  
  GVar14._1_7_ = in_register_00000081;
  GVar14.offset._0_1_ = noResult;
  pattern = (regularExpression->pattern).ptr;
  pcVar12 = JavascriptString::GetString(replace);
  cVar8 = JavascriptString::GetLength(replace);
  input_00 = JavascriptString::GetString(input);
  inputLength = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,(Use)regularExpression,(JavascriptRegExp *)input,replace,
                   (JavascriptString *)GVar14);
  PrimBeginMatch((RegexMatchState *)local_e8,scriptContext,pattern,input_00,GVar14.offset,true);
  isGlobal = UnifiedRegex::RegexPattern::IsGlobal(pattern);
  isSticky = UnifiedRegex::RegexPattern::IsSticky(pattern);
  offset = 0;
  if ((isSticky && !isGlobal) && (offset = regularExpression->lastIndexOrFlag, offset == 0xfffffffe)
     ) {
    JavascriptRegExp::CacheLastIndex(regularExpression);
    offset = regularExpression->lastIndexOrFlag;
  }
  if (noResult) {
    pRVar27 = (RuntimeFunction *)0xffffffff;
    local_58.offset = 0;
    local_58.length = 0;
    pRVar28 = pRVar27;
    if (inputLength < offset) {
      local_48.ptr = (RuntimeFunction *)0xffffffff;
      GVar13.offset = 0;
      GVar13.length = 0;
    }
    else {
      GVar14.length = 0;
      GVar14.offset = offset;
      GVar13 = PrimMatch((RegexMatchState *)local_e8,scriptContext,pattern,inputLength,offset);
      if ((RuntimeFunction *)((ulong)GVar13 >> 0x20) == (RuntimeFunction *)0xffffffff) {
        local_48.ptr = (RuntimeFunction *)0xffffffff;
      }
      else {
        pRVar3 = (RuntimeFunction *)((ulong)GVar13 >> 0x20);
        do {
          local_48.ptr = pRVar3;
          local_58 = (GroupInfo)((ulong)GVar13 & 0xffffffff);
          pRVar28 = local_48.ptr;
          if (!isGlobal) break;
          iVar22 = (int)local_48.ptr;
          if ((ulong)GVar13 >> 0x20 == 0) {
            iVar22 = 1;
          }
          GVar14.offset = iVar22 + GVar13.offset;
          GVar14.length = 0;
          pRVar28 = pRVar27;
          if (inputLength < GVar14.offset) break;
          GVar13 = PrimMatch((RegexMatchState *)local_e8,scriptContext,pattern,inputLength,
                             GVar14.offset);
          pRVar3 = (RuntimeFunction *)((ulong)GVar13 >> 0x20);
        } while ((RuntimeFunction *)((ulong)GVar13 >> 0x20) != (RuntimeFunction *)0xffffffff);
      }
    }
    pJVar21 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    pJVar15 = JavascriptLibrary::GetEmptyString(pJVar21);
  }
  else {
    concatenated.isFinalized = false;
    concatenated._545_7_ = 0;
    uVar9 = GetReplaceSubstitutions
                      (pcVar12,cVar8,(ArenaAllocator *)(state.input + 4),
                       (CharCount **)&concatenated.isFinalized);
    CompoundString::Builder<256U>::Builder((Builder<256U> *)local_328,scriptContext);
    if (offset != 0) {
      CVar24 = inputLength;
      if (offset < inputLength) {
        CVar24 = offset;
      }
      if (concatenated._520_8_ == 0) {
        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                  (input,0,CVar24,(Builder<256U> *)local_328,false);
      }
      else {
        CompoundString::Append((CompoundString *)concatenated._520_8_,input,0,CVar24);
      }
    }
    uVar2 = concatenated._544_8_;
    if (inputLength < offset) {
      GVar13.offset = 0;
      GVar13.length = 0;
      pRVar28 = (RuntimeFunction *)0xffffffff;
      local_48.ptr = (RuntimeFunction *)0xffffffff;
      local_58.offset = 0;
      local_58.length = 0;
    }
    else {
      pJVar21 = (JavascriptLibrary *)local_e8;
      GVar13 = PrimMatch((RegexMatchState *)pJVar21,scriptContext,pattern,inputLength,offset);
      if ((RuntimeFunction *)((ulong)GVar13 >> 0x20) == (RuntimeFunction *)0xffffffff) {
        local_48.ptr = (RuntimeFunction *)0xffffffff;
        local_58.offset = 0;
        local_58.length = 0;
      }
      else {
        pRVar28 = (RuntimeFunction *)((ulong)GVar13 >> 0x20);
        do {
          local_48.ptr = pRVar28;
          uVar17 = GVar13.offset;
          if (concatenated._520_8_ == 0) {
            CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                      (input,offset,uVar17 - offset,(Builder<256U> *)local_328,false);
          }
          else {
            CompoundString::Append
                      ((CompoundString *)concatenated._520_8_,input,offset,uVar17 - offset);
          }
          CVar24 = (CharCount)local_48.ptr;
          state.matcher = (Matcher *)((ulong)GVar13 & 0xffffffff);
          pJVar21 = (JavascriptLibrary *)replace;
          if (uVar2 == 0) {
            if (concatenated._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (replace,(Builder<256U> *)local_328,false);
            }
            else {
              pJVar21 = (JavascriptLibrary *)concatenated._520_8_;
              CompoundString::Append((CompoundString *)concatenated._520_8_,replace);
            }
          }
          else {
            uVar5 = UnifiedRegex::RegexPattern::NumGroups(pattern);
            nonMatchValue =
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
            cVar8 = JavascriptString::GetLength(input);
            pcVar12 = JavascriptString::GetString(replace);
            cVar10 = JavascriptString::GetLength(replace);
            if ((int)uVar9 < 1) {
              CVar25 = 0;
            }
            else {
              s = input_00 + (long)state.matcher;
              uVar11 = CVar24 + uVar17;
              uVar20 = 0;
              uVar26 = 0;
              do {
                CVar25 = *(CharCount *)(uVar2 + uVar20 * 4);
                CVar18 = (CharCount)uVar26;
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar18,CVar25 - CVar18,(Builder<256U> *)local_328,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,replace,CVar18,CVar25 - CVar18);
                }
                uVar26 = (ulong)(CVar25 + 1);
                cVar1 = pcVar12[uVar26];
                uVar6 = cVar1 + L'￐';
                if (uVar6 < 10) {
                  uVar19 = CVar25 + 2;
                  uVar26 = (ulong)uVar19;
                  uVar7 = uVar6;
                  if ((uVar19 < cVar10) && ((ushort)(pcVar12[uVar19] + L'￐') < 10)) {
                    uVar16 = pcVar12[uVar19] + L'￐' + uVar6 * 10;
                    uVar7 = uVar16;
                    if (uVar5 <= uVar16) {
                      uVar7 = uVar6;
                    }
                    if (uVar5 > uVar16) {
                      uVar26 = (ulong)(CVar25 + 3);
                    }
                  }
                  if (uVar7 == 0 || uVar5 <= uVar7) {
                    CVar18 = (int)uVar26 - CVar25;
                    if (concatenated._520_8_ == 0) {
LAB_00d3cd7f:
                      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                (replace,CVar25,CVar18,(Builder<256U> *)local_328,false);
                    }
                    else {
LAB_00d3cd1c:
                      CompoundString::Append
                                ((CompoundString *)concatenated._520_8_,replace,CVar25,CVar18);
                    }
                  }
                  else {
                    GVar14 = UnifiedRegex::RegexPattern::GetGroup(pattern,(uint)uVar7);
                    aValue = (RecyclableObject *)GetString(scriptContext,input,nonMatchValue,GVar14)
                    ;
                    bVar4 = VarIs<Js::JavascriptString>(aValue);
                    if (bVar4) {
                      pJVar15 = UnsafeVarTo<Js::JavascriptString>(aValue);
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (pJVar15,(Builder<256U> *)local_328,false);
                      }
                      else {
                        CompoundString::Append((CompoundString *)concatenated._520_8_,pJVar15);
                      }
                    }
                    else if (aValue != nonMatchValue) {
                      CVar18 = (int)uVar26 - CVar25;
                      if (concatenated._520_8_ != 0) goto LAB_00d3cd1c;
                      goto LAB_00d3cd7f;
                    }
                  }
                }
                else {
                  if ((ushort)cVar1 < 0x27) {
                    if (cVar1 == L'$') {
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (L'$',(Builder<256U> *)local_328,false);
                      }
                      else {
                        CompoundString::Append((CompoundString *)concatenated._520_8_,L'$');
                      }
                    }
                    else {
                      if (cVar1 != L'&') {
LAB_00d3cd9c:
                        if (concatenated._520_8_ == 0) {
                          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                    (L'$',(Builder<256U> *)local_328,false);
                        }
                        else {
                          CompoundString::Append((CompoundString *)concatenated._520_8_,L'$');
                        }
                        goto LAB_00d3ce9f;
                      }
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (s,CVar24,(Builder<256U> *)local_328,false);
                      }
                      else {
                        CompoundString::Append((CompoundString *)concatenated._520_8_,s,CVar24);
                      }
                    }
                  }
                  else if (cVar1 == L'\'') {
                    if (uVar11 < cVar8) {
                      CVar18 = uVar11;
                      uVar19 = cVar8 - uVar11;
                      if (concatenated._520_8_ != 0) goto LAB_00d3ce05;
LAB_00d3ce89:
                      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                (input,CVar18,uVar19,(Builder<256U> *)local_328,false);
                    }
                  }
                  else {
                    if (cVar1 != L'`') goto LAB_00d3cd9c;
                    if (concatenated._520_8_ == 0) {
                      CVar18 = 0;
                      uVar19 = uVar17;
                      goto LAB_00d3ce89;
                    }
                    CVar18 = 0;
                    uVar19 = uVar17;
LAB_00d3ce05:
                    CompoundString::Append
                              ((CompoundString *)concatenated._520_8_,input,CVar18,uVar19);
                  }
                  uVar26 = (ulong)(CVar25 + 2);
                }
LAB_00d3ce9f:
                CVar25 = (CharCount)uVar26;
                uVar20 = uVar20 + 1;
              } while (uVar9 != uVar20);
            }
            if (concatenated._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (replace,CVar25,cVar10 - CVar25,(Builder<256U> *)local_328,false);
            }
            else {
              pJVar21 = (JavascriptLibrary *)concatenated._520_8_;
              CompoundString::Append
                        ((CompoundString *)concatenated._520_8_,replace,CVar25,cVar10 - CVar25);
            }
          }
          if ((ulong)GVar13 >> 0x20 == 0) {
            if (uVar17 < inputLength) {
              cVar1 = input_00[(long)state.matcher];
              if (concatenated._520_8_ == 0) {
                pJVar21 = (JavascriptLibrary *)(ulong)(ushort)cVar1;
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (cVar1,(Builder<256U> *)local_328,false);
              }
              else {
                pJVar21 = (JavascriptLibrary *)concatenated._520_8_;
                CompoundString::Append((CompoundString *)concatenated._520_8_,cVar1);
              }
            }
            offset = uVar17 + 1;
          }
          else {
            offset = CVar24 + uVar17;
          }
          pRVar28 = local_48.ptr;
          local_58 = GVar13;
          if (!isGlobal) goto LAB_00d3cff3;
          if (inputLength < offset) {
            pRVar28 = (RuntimeFunction *)0xffffffff;
            goto LAB_00d3d003;
          }
          pJVar21 = (JavascriptLibrary *)local_e8;
          GVar13 = PrimMatch((RegexMatchState *)pJVar21,scriptContext,pattern,inputLength,offset);
          pRVar28 = (RuntimeFunction *)((ulong)GVar13 >> 0x20);
        } while ((RuntimeFunction *)((ulong)GVar13 >> 0x20) != (RuntimeFunction *)0xffffffff);
      }
      pRVar28 = (RuntimeFunction *)0xffffffff;
LAB_00d3cff3:
      GVar14.length = 0;
      GVar14.offset = inputLength;
      pJVar15 = input;
      if (offset == 0) goto LAB_00d3d053;
    }
LAB_00d3d003:
    GVar23.offset = inputLength - offset;
    GVar23.length = 0;
    GVar14 = GVar23;
    if (offset <= inputLength && GVar23.offset != 0) {
      if (concatenated._520_8_ == 0) {
        GVar14.offset = 0;
        GVar14.length = 0;
        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                  (input,offset,GVar23.offset,(Builder<256U> *)local_328,false);
      }
      else {
        CompoundString::Append((CompoundString *)concatenated._520_8_,input,offset,GVar23.offset);
        GVar14 = GVar23;
      }
    }
    pJVar21 = (JavascriptLibrary *)local_328;
    pJVar15 = CompoundString::Builder<256U>::ToString((Builder<256U> *)pJVar21);
  }
LAB_00d3d053:
  if (state.input != (char16 *)0x0) {
    pJVar21 = (JavascriptLibrary *)scriptContext;
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,(TempArenaAllocatorObject *)state.input);
  }
  PropagateLastMatchToRegex
            ((ScriptContext *)pJVar21,isGlobal,isSticky,regularExpression,GVar14,
             (GroupInfo)((ulong)GVar13 & 0xffffffff | (long)pRVar28 << 0x20));
  PropagateLastMatchToCtor
            (scriptContext,regularExpression,input,
             (GroupInfo)((ulong)local_58 & 0xffffffff | (long)local_48.ptr << 0x20),false);
  return pJVar15;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* replaceStr = replace->GetString();
        CharCount replaceLength = replace->GetLength();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

        JavascriptString* newString = nullptr;

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, replace);
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, true);

        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        if (!noResult)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(replaceStr, replaceLength,
                 state.tempAllocatorObj->GetAllocator(), &substitutionOffsets);

            // Use to see if we already have partial result populated in concatenated
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);

            // If lastIndex > 0, append input[0..offset] characters to the result
            if (offset > 0)
            {
                concatenated.Append(input, 0, min(offset, inputLength));
            }

            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }

                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                concatenated.Append(input, offset, lastActualMatch.offset - offset);
                if (substitutionOffsets != 0)
                {
                    auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                        return GetGroup(scriptContext, pattern, input, nonMatchValue, captureIndex);
                    };
                    const char16* matchedString = inputStr + lastActualMatch.offset;
                    ReplaceFormatString(scriptContext, pattern->NumGroups(), getGroup, input, matchedString, lastActualMatch, replace, substitutions, substitutionOffsets, concatenated);
                }
                else
                {
                    concatenated.Append(replace);
                }
                if (lastActualMatch.length == 0)
                {
                    if (lastActualMatch.offset < inputLength)
                    {
                        concatenated.Append(inputStr[lastActualMatch.offset]);
                    }
                    offset = lastActualMatch.offset + 1;
                }
                else
                {
                    offset = lastActualMatch.EndOffset();
                }
            }
            while (isGlobal);

            if (offset == 0)
            {
                // There was no successful match so the result is the input string.
                newString = input;
            }
            else
            {
                if (offset < inputLength)
                {
                    concatenated.Append(input, offset, inputLength - offset);
                }
                newString = concatenated.ToString();
            }
            substitutionOffsets = 0;
        }
        else
        {
            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }
                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                offset = lastActualMatch.length == 0? lastActualMatch.offset + 1 : lastActualMatch.EndOffset();
            }
            while (isGlobal);
            newString = scriptContext->GetLibrary()->GetEmptyString();
        }

        PrimEndMatch(state, scriptContext, pattern);
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }